

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfdcapi_common.cpp
# Opt level: O0

void __thiscall
cfdcapi_common_CfdSerializeByteData_Test::TestBody(cfdcapi_common_CfdSerializeByteData_Test *this)

{
  bool bVar1;
  char *pcVar2;
  char *in_R9;
  AssertionResult gtest_ar_9;
  AssertionResult gtest_ar_8;
  AssertionResult gtest_ar_7;
  AssertionResult gtest_ar_6;
  AssertionResult gtest_ar_5;
  char *exp;
  char *target;
  AssertionResult gtest_ar_4;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  char *output;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  int ret;
  void *handle;
  bool *in_stack_fffffffffffffcf8;
  AssertionResult *in_stack_fffffffffffffd00;
  CfdErrorCode *in_stack_fffffffffffffd08;
  AssertionResult *this_00;
  undefined7 in_stack_fffffffffffffd10;
  undefined1 in_stack_fffffffffffffd17;
  void **in_stack_fffffffffffffd18;
  AssertHelper local_200;
  Message local_1f8;
  undefined4 local_1ec;
  AssertionResult local_1e8;
  AssertHelper local_1d8;
  Message local_1d0;
  undefined4 local_1c4;
  AssertionResult local_1c0;
  AssertHelper local_1b0;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffe58;
  undefined4 in_stack_fffffffffffffe60;
  undefined4 in_stack_fffffffffffffe64;
  undefined4 uVar3;
  void *in_stack_fffffffffffffe68;
  AssertHelper local_188;
  Message local_180;
  AssertionResult local_178;
  AssertHelper local_168;
  Message local_160;
  undefined4 local_154;
  AssertionResult local_150;
  char *local_140;
  char *local_138;
  AssertHelper local_130;
  Message local_128;
  AssertionResult local_120;
  AssertHelper local_110;
  Message local_108;
  undefined4 local_fc;
  AssertionResult local_f8;
  AssertHelper local_e8;
  Message local_e0;
  AssertionResult local_d8;
  AssertHelper local_c8;
  Message local_c0;
  undefined4 local_b4;
  AssertionResult local_b0;
  char *local_a0;
  string local_98;
  AssertHelper local_78;
  Message local_70;
  undefined1 local_61;
  AssertionResult local_60;
  AssertHelper local_50;
  Message local_48 [3];
  undefined4 local_2c;
  AssertionResult local_28;
  int local_14;
  long local_10;
  
  local_10 = 0;
  local_14 = CfdCreateHandle(in_stack_fffffffffffffd18);
  local_2c = 0;
  testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
            ((char *)in_stack_fffffffffffffd18,
             (char *)CONCAT17(in_stack_fffffffffffffd17,in_stack_fffffffffffffd10),
             in_stack_fffffffffffffd08,(int *)in_stack_fffffffffffffd00);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_28);
  if (!bVar1) {
    testing::Message::Message(local_48);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x330a5a);
    testing::internal::AssertHelper::AssertHelper
              (&local_50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_common.cpp"
               ,0x1bf,pcVar2);
    testing::internal::AssertHelper::operator=(&local_50,local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_50);
    testing::Message::~Message((Message *)0x330abd);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x330b12);
  local_61 = local_10 != 0;
  testing::AssertionResult::AssertionResult<bool>
            (in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8,(type *)0x330b46);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_60);
  if (!bVar1) {
    testing::Message::Message(&local_70);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_98,(internal *)&local_60,(AssertionResult *)"(NULL == handle)","true","false",
               in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_common.cpp"
               ,0x1c0,pcVar2);
    testing::internal::AssertHelper::operator=(&local_78,&local_70);
    testing::internal::AssertHelper::~AssertHelper(&local_78);
    std::__cxx11::string::~string((string *)&local_98);
    testing::Message::~Message((Message *)0x330c42);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x330cbd);
  local_a0 = (char *)0x0;
  local_14 = CfdSerializeByteData
                       (in_stack_fffffffffffffe68,
                        (char *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
                        (char **)in_stack_fffffffffffffe58.ptr_);
  local_b4 = 0;
  testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
            ((char *)in_stack_fffffffffffffd18,
             (char *)CONCAT17(in_stack_fffffffffffffd17,in_stack_fffffffffffffd10),
             in_stack_fffffffffffffd08,(int *)in_stack_fffffffffffffd00);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_b0);
  if (!bVar1) {
    testing::Message::Message(&local_c0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x330d99);
    testing::internal::AssertHelper::AssertHelper
              (&local_c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_common.cpp"
               ,0x1c5,pcVar2);
    testing::internal::AssertHelper::operator=(&local_c8,&local_c0);
    testing::internal::AssertHelper::~AssertHelper(&local_c8);
    testing::Message::~Message((Message *)0x330dfc);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x330e51);
  if (local_14 == 0) {
    testing::internal::CmpHelperSTREQ
              ((internal *)&local_d8,"\"060123456789ab\"","output","060123456789ab",local_a0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_d8);
    if (!bVar1) {
      testing::Message::Message(&local_e0);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x330f00);
      testing::internal::AssertHelper::AssertHelper
                (&local_e8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_common.cpp"
                 ,0x1c7,pcVar2);
      testing::internal::AssertHelper::operator=(&local_e8,&local_e0);
      testing::internal::AssertHelper::~AssertHelper(&local_e8);
      testing::Message::~Message((Message *)0x330f63);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x330fb8);
    CfdFreeStringBuffer((char *)in_stack_fffffffffffffd08);
    local_a0 = (char *)0x0;
  }
  local_14 = CfdSerializeByteData
                       (in_stack_fffffffffffffe68,
                        (char *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
                        (char **)in_stack_fffffffffffffe58.ptr_);
  local_fc = 0;
  testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
            ((char *)in_stack_fffffffffffffd18,
             (char *)CONCAT17(in_stack_fffffffffffffd17,in_stack_fffffffffffffd10),
             in_stack_fffffffffffffd08,(int *)in_stack_fffffffffffffd00);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_f8);
  if (!bVar1) {
    testing::Message::Message(&local_108);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x3310a3);
    testing::internal::AssertHelper::AssertHelper
              (&local_110,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_common.cpp"
               ,0x1cd,pcVar2);
    testing::internal::AssertHelper::operator=(&local_110,&local_108);
    testing::internal::AssertHelper::~AssertHelper(&local_110);
    testing::Message::~Message((Message *)0x331106);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x33115b);
  if (local_14 == 0) {
    testing::internal::CmpHelperSTREQ((internal *)&local_120,"\"00\"","output","00",local_a0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_120);
    if (!bVar1) {
      testing::Message::Message(&local_128);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x33120a);
      testing::internal::AssertHelper::AssertHelper
                (&local_130,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_common.cpp"
                 ,0x1cf,pcVar2);
      testing::internal::AssertHelper::operator=(&local_130,&local_128);
      testing::internal::AssertHelper::~AssertHelper(&local_130);
      testing::Message::~Message((Message *)0x33126d);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x3312c2);
    CfdFreeStringBuffer((char *)in_stack_fffffffffffffd08);
    local_a0 = (char *)0x0;
  }
  local_138 = 
  "111111111111111111112222222222222222222233333333333333333333444444444444444444445555555555555555555566666666666666666666777777777777777777778888888888888888888899999999999999999999aaaaaaaaaaaaaaaaaaaabbbbbbbbbbbbbbbbbbbbccccccccccccccccccccdddddddddddddddddddd111111111111111111112222222222222222222233333333333333333333444444444444444444445555555555555555555566666666666666666666777777777777777777778888888888888888888899999999999999999999aaaaaaaaaaaaaaaaaaaabbbbbbbbbbbbbbbbbbbbccccccccccccccccccccdddddddddddddddddddd"
  ;
  local_140 = 
  "fd0401111111111111111111112222222222222222222233333333333333333333444444444444444444445555555555555555555566666666666666666666777777777777777777778888888888888888888899999999999999999999aaaaaaaaaaaaaaaaaaaabbbbbbbbbbbbbbbbbbbbccccccccccccccccccccdddddddddddddddddddd111111111111111111112222222222222222222233333333333333333333444444444444444444445555555555555555555566666666666666666666777777777777777777778888888888888888888899999999999999999999aaaaaaaaaaaaaaaaaaaabbbbbbbbbbbbbbbbbbbbccccccccccccccccccccdddddddddddddddddddd"
  ;
  local_14 = CfdSerializeByteData
                       (in_stack_fffffffffffffe68,
                        (char *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
                        (char **)in_stack_fffffffffffffe58.ptr_);
  local_154 = 0;
  testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
            ((char *)in_stack_fffffffffffffd18,
             (char *)CONCAT17(in_stack_fffffffffffffd17,in_stack_fffffffffffffd10),
             in_stack_fffffffffffffd08,(int *)in_stack_fffffffffffffd00);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_150);
  if (!bVar1) {
    testing::Message::Message(&local_160);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x3313c0);
    testing::internal::AssertHelper::AssertHelper
              (&local_168,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_common.cpp"
               ,0x1d7,pcVar2);
    testing::internal::AssertHelper::operator=(&local_168,&local_160);
    testing::internal::AssertHelper::~AssertHelper(&local_168);
    testing::Message::~Message((Message *)0x33141d);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x331472);
  if (local_14 == 0) {
    testing::internal::CmpHelperSTREQ((internal *)&local_178,"exp","output",local_140,local_a0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_178);
    if (!bVar1) {
      testing::Message::Message(&local_180);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x331516);
      testing::internal::AssertHelper::AssertHelper
                (&local_188,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_common.cpp"
                 ,0x1d9,pcVar2);
      testing::internal::AssertHelper::operator=(&local_188,&local_180);
      testing::internal::AssertHelper::~AssertHelper(&local_188);
      testing::Message::~Message((Message *)0x331573);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x3315c8);
    CfdFreeStringBuffer((char *)in_stack_fffffffffffffd08);
    local_a0 = (char *)0x0;
  }
  local_14 = CfdSerializeByteData
                       (in_stack_fffffffffffffe68,
                        (char *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
                        (char **)in_stack_fffffffffffffe58.ptr_);
  uVar3 = 1;
  testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
            ((char *)in_stack_fffffffffffffd18,
             (char *)CONCAT17(in_stack_fffffffffffffd17,in_stack_fffffffffffffd10),
             in_stack_fffffffffffffd08,(int *)in_stack_fffffffffffffd00);
  bVar1 = testing::AssertionResult::operator_cast_to_bool
                    ((AssertionResult *)&stack0xfffffffffffffe68);
  if (!bVar1) {
    testing::Message::Message((Message *)&stack0xfffffffffffffe58);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x3316a3);
    testing::internal::AssertHelper::AssertHelper
              (&local_1b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_common.cpp"
               ,0x1df,pcVar2);
    testing::internal::AssertHelper::operator=(&local_1b0,(Message *)&stack0xfffffffffffffe58);
    testing::internal::AssertHelper::~AssertHelper(&local_1b0);
    testing::Message::~Message((Message *)0x331700);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x331758);
  local_14 = CfdSerializeByteData
                       (in_stack_fffffffffffffe68,(char *)CONCAT44(uVar3,in_stack_fffffffffffffe60),
                        (char **)in_stack_fffffffffffffe58.ptr_);
  local_1c4 = 1;
  testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
            ((char *)in_stack_fffffffffffffd18,
             (char *)CONCAT17(in_stack_fffffffffffffd17,in_stack_fffffffffffffd10),
             in_stack_fffffffffffffd08,(int *)in_stack_fffffffffffffd00);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1c0);
  if (!bVar1) {
    testing::Message::Message(&local_1d0);
    in_stack_fffffffffffffd18 =
         (void **)testing::AssertionResult::failure_message((AssertionResult *)0x331819);
    testing::internal::AssertHelper::AssertHelper
              (&local_1d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_common.cpp"
               ,0x1e2,(char *)in_stack_fffffffffffffd18);
    testing::internal::AssertHelper::operator=(&local_1d8,&local_1d0);
    testing::internal::AssertHelper::~AssertHelper(&local_1d8);
    testing::Message::~Message((Message *)0x331876);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x3318cb);
  local_14 = CfdFreeHandle(in_stack_fffffffffffffd08);
  local_1ec = 0;
  this_00 = &local_1e8;
  testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
            ((char *)in_stack_fffffffffffffd18,
             (char *)CONCAT17(in_stack_fffffffffffffd17,in_stack_fffffffffffffd10),
             (CfdErrorCode *)this_00,(int *)in_stack_fffffffffffffd00);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(this_00);
  if (!bVar1) {
    testing::Message::Message(&local_1f8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x331980);
    testing::internal::AssertHelper::AssertHelper
              (&local_200,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_common.cpp"
               ,0x1e5,pcVar2);
    testing::internal::AssertHelper::operator=(&local_200,&local_1f8);
    testing::internal::AssertHelper::~AssertHelper(&local_200);
    testing::Message::~Message((Message *)0x3319dd);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x331a32);
  return;
}

Assistant:

TEST(cfdcapi_common, CfdSerializeByteData) {
  void* handle = NULL;
  int ret = CfdCreateHandle(&handle);
  EXPECT_EQ(kCfdSuccess, ret);
  EXPECT_FALSE((NULL == handle));

  char* output = nullptr;

  ret = CfdSerializeByteData(handle, "0123456789ab", &output);
  EXPECT_EQ(kCfdSuccess, ret);
  if (ret == kCfdSuccess) {
    EXPECT_STREQ("060123456789ab", output);
    CfdFreeStringBuffer(output);
    output = nullptr;
  }

  ret = CfdSerializeByteData(handle, "", &output);
  EXPECT_EQ(kCfdSuccess, ret);
  if (ret == kCfdSuccess) {
    EXPECT_STREQ("00", output);
    CfdFreeStringBuffer(output);
    output = nullptr;
  }

  const char* target = "111111111111111111112222222222222222222233333333333333333333444444444444444444445555555555555555555566666666666666666666777777777777777777778888888888888888888899999999999999999999aaaaaaaaaaaaaaaaaaaabbbbbbbbbbbbbbbbbbbbccccccccccccccccccccdddddddddddddddddddd111111111111111111112222222222222222222233333333333333333333444444444444444444445555555555555555555566666666666666666666777777777777777777778888888888888888888899999999999999999999aaaaaaaaaaaaaaaaaaaabbbbbbbbbbbbbbbbbbbbccccccccccccccccccccdddddddddddddddddddd";
  const char* exp = "fd0401111111111111111111112222222222222222222233333333333333333333444444444444444444445555555555555555555566666666666666666666777777777777777777778888888888888888888899999999999999999999aaaaaaaaaaaaaaaaaaaabbbbbbbbbbbbbbbbbbbbccccccccccccccccccccdddddddddddddddddddd111111111111111111112222222222222222222233333333333333333333444444444444444444445555555555555555555566666666666666666666777777777777777777778888888888888888888899999999999999999999aaaaaaaaaaaaaaaaaaaabbbbbbbbbbbbbbbbbbbbccccccccccccccccccccdddddddddddddddddddd";
  ret = CfdSerializeByteData(handle, target, &output);
  EXPECT_EQ(kCfdSuccess, ret);
  if (ret == kCfdSuccess) {
    EXPECT_STREQ(exp, output);
    CfdFreeStringBuffer(output);
    output = nullptr;
  }

  ret = CfdSerializeByteData(handle, "", nullptr);
  EXPECT_EQ(kCfdIllegalArgumentError, ret);

  ret = CfdSerializeByteData(handle, nullptr, &output);
  EXPECT_EQ(kCfdIllegalArgumentError, ret);

  ret = CfdFreeHandle(handle);
  EXPECT_EQ(kCfdSuccess, ret);
}